

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.h
# Opt level: O0

bool __thiscall
SGParser::TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>::
Advance(TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
        *this)

{
  bool bVar1;
  byte bVar2;
  uint local_24;
  bool hasAdvanced;
  TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
  *this_local;
  
  LineOffsetPosTracker::AdvanceChar(this->Pos,this->Character);
  LineOffsetPosTracker::AdvanceByte(this->Pos);
  bVar1 = TokenizerBase::ByteReader::Advance(&this->Reader);
  if (bVar1) {
    bVar2 = TokenizerBase::ByteReader::GetByte(&this->Reader);
    local_24 = (uint)bVar2;
  }
  else {
    local_24 = 0;
  }
  this->Character = local_24;
  return bVar1;
}

Assistant:

bool Advance() {
        Pos.AdvanceChar(Character);
        Pos.AdvanceByte();
        const bool hasAdvanced = Reader.Advance();
        Character              = hasAdvanced ? Reader.GetByte() : 0u;
        return hasAdvanced;
    }